

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::handle
          (CombinedImageSamplerHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  ID id;
  int iVar1;
  VariableID combined_module_id;
  SPIRFunction *caller;
  size_t sVar2;
  CombinedImageSampler *pCVar3;
  bool bVar4;
  undefined2 uVar5;
  Dim DVar6;
  bool bVar7;
  undefined1 uVar8;
  ImageFormat IVar9;
  AccessQualifier AVar10;
  TypeID TVar11;
  TypeID TVar12;
  bool bVar13;
  ID id_00;
  ID id_01;
  uint32_t uVar14;
  uint32_t uVar15;
  ulong uVar16;
  SPIRVariable *pSVar17;
  SPIRType *pSVar18;
  runtime_error *prVar19;
  _Elt_pointer ppSVar20;
  SPIRType *pSVar21;
  uint32_t *puVar22;
  CombinedImageSampler *pCVar23;
  undefined1 **args_1;
  CombinedImageSampler *pCVar24;
  VariableID image_id;
  long lVar25;
  Compiler *pCVar26;
  undefined1 **args_2;
  VariableID sampler_id;
  uint32_t result_type;
  uint32_t result_type_1;
  ID local_70;
  undefined1 local_6c [12];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  SmallVector<bool,_8UL> *local_40;
  int local_34;
  
  uVar16 = (ulong)(opcode - OpAccessChain);
  if (0x2a < opcode - OpAccessChain) {
LAB_0033a313:
    if (opcode != OpLoad) {
      return true;
    }
    if (length < 3) {
      return false;
    }
    local_60[0] = (undefined1 *)CONCAT44(local_60[0]._4_4_,*args);
    pSVar18 = Variant::get<spirv_cross::SPIRType>
                        ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + *args
                        );
    iVar1 = *(int *)&(pSVar18->super_IVariant).field_0xc;
    if ((iVar1 != 0x12) && ((pSVar18->image).sampled != 1 || iVar1 != 0x10)) {
      return true;
    }
    uVar14 = args[1];
    uVar15 = args[2];
    pCVar26 = this->compiler;
    args_2 = (undefined1 **)local_6c;
    local_6c[0] = 1;
    args_1 = local_60;
LAB_0033a483:
    set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
              (pCVar26,uVar14,(char (*) [1])0x35b140,(uint *)args_1,(bool *)args_2);
    register_read(this->compiler,uVar14,uVar15,true);
    return true;
  }
  if ((0x6c040000000U >> (uVar16 & 0x3f) & 1) == 0) {
    if ((7UL >> (uVar16 & 0x3f) & 1) != 0) {
      if (length < 3) {
        return false;
      }
      local_6c._0_4_ = *args;
      pSVar18 = Variant::get<spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                           (uint)local_6c._0_4_);
      iVar1 = *(int *)&(pSVar18->super_IVariant).field_0xc;
      if (iVar1 == 0x12) {
        prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_60[0] = local_50;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,
                   "Attempting to use arrays or structs of separate samplers. This is not possible to statically remap to plain GLSL."
                   ,"");
        ::std::runtime_error::runtime_error(prVar19,(string *)local_60);
        *(undefined ***)prVar19 = &PTR__runtime_error_003fce08;
        __cxa_throw(prVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (iVar1 != 0x10) {
        return true;
      }
      if ((pSVar18->image).sampled != 1) {
        return true;
      }
      uVar14 = args[1];
      uVar15 = args[2];
      pCVar26 = this->compiler;
      args_2 = local_60;
      local_60[0] = (undefined1 *)CONCAT71(local_60[0]._1_7_,1);
      args_1 = (undefined1 **)local_6c;
      goto LAB_0033a483;
    }
    if (uVar16 != 0x15) goto LAB_0033a313;
    bVar13 = false;
  }
  else {
    pSVar17 = maybe_get_backing_variable(this->compiler,args[2]);
    if (pSVar17 == (SPIRVariable *)0x0) {
      bVar13 = false;
    }
    else {
      pSVar18 = Variant::get<spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                           *(uint *)&(pSVar17->super_IVariant).field_0xc);
      bVar13 = false;
      if ((((*(int *)&(pSVar18->super_IVariant).field_0xc == 0x10) &&
           ((pSVar18->image).sampled == 1)) && (bVar13 = false, (pSVar18->image).dim != DimBuffer))
         && (bVar13 = true, this->compiler->dummy_sampler_id == 0)) {
        prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_60[0] = local_50;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,
                   "texelFetch without sampler was found, but no dummy sampler has been created with build_dummy_sampler_for_combined_images()."
                   ,"");
        ::std::runtime_error::runtime_error(prVar19,(string *)local_60);
        *(undefined ***)prVar19 = &PTR__runtime_error_003fce08;
        __cxa_throw(prVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if (!bVar13) {
      return true;
    }
  }
  ppSVar20 = (this->functions).c.
             super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppSVar20 !=
      (this->functions).c.
      super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppSVar20 ==
        (this->functions).c.
        super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppSVar20 = (this->functions).c.
                 super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    caller = ppSVar20[-1];
    if (caller->do_combined_parameters == true) {
      image_id.id = args[2];
      pSVar17 = maybe_get_backing_variable(this->compiler,image_id.id);
      if (pSVar17 != (SPIRVariable *)0x0) {
        image_id.id = (pSVar17->super_IVariant).self.id;
      }
      puVar22 = args + 3;
      if (bVar13) {
        puVar22 = &this->compiler->dummy_sampler_id;
      }
      sampler_id.id = *puVar22;
      pSVar17 = maybe_get_backing_variable(this->compiler,sampler_id.id);
      if (pSVar17 != (SPIRVariable *)0x0) {
        sampler_id.id = (pSVar17->super_IVariant).self.id;
      }
      combined_module_id.id = args[1];
      pSVar18 = Variant::get<spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                           *args);
      register_combined_image_sampler
                (this,caller,combined_module_id,image_id,sampler_id,(pSVar18->image).depth);
    }
  }
  id_00.id = remap_parameter(this,args[2]);
  if (bVar13) {
    id_01.id = this->compiler->dummy_sampler_id;
  }
  else {
    id_01.id = remap_parameter(this,args[3]);
  }
  pCVar26 = this->compiler;
  pCVar24 = (pCVar26->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
            ptr;
  sVar2 = (pCVar26->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
          buffer_size;
  pCVar3 = pCVar24 + sVar2;
  lVar25 = (long)sVar2 >> 2;
  pCVar23 = pCVar24;
  if (0 < lVar25) {
    pCVar23 = pCVar24 + lVar25 * 4;
    lVar25 = lVar25 + 1;
    pCVar24 = pCVar24 + 2;
    do {
      if ((pCVar24[-2].image_id.id == id_00.id) && (pCVar24[-2].sampler_id.id == id_01.id)) {
        pCVar24 = pCVar24 + -2;
        goto LAB_0033a4cc;
      }
      if ((pCVar24[-1].image_id.id == id_00.id) && (pCVar24[-1].sampler_id.id == id_01.id)) {
        pCVar24 = pCVar24 + -1;
        goto LAB_0033a4cc;
      }
      if (((pCVar24->image_id).id == id_00.id) && ((pCVar24->sampler_id).id == id_01.id))
      goto LAB_0033a4cc;
      if ((pCVar24[1].image_id.id == id_00.id) && (pCVar24[1].sampler_id.id == id_01.id)) {
        pCVar24 = pCVar24 + 1;
        goto LAB_0033a4cc;
      }
      lVar25 = lVar25 + -1;
      pCVar24 = pCVar24 + 4;
    } while (1 < lVar25);
  }
  lVar25 = ((long)pCVar3 - (long)pCVar23 >> 2) * -0x5555555555555555;
  if (lVar25 != 1) {
    if (lVar25 != 2) {
      pCVar24 = pCVar3;
      if ((lVar25 != 3) ||
         (((pCVar23->image_id).id == id_00.id &&
          (pCVar24 = pCVar23, (pCVar23->sampler_id).id == id_01.id)))) goto LAB_0033a4cc;
      pCVar23 = pCVar23 + 1;
    }
    if (((pCVar23->image_id).id == id_00.id) &&
       (pCVar24 = pCVar23, (pCVar23->sampler_id).id == id_01.id)) goto LAB_0033a4cc;
    pCVar23 = pCVar23 + 1;
  }
  pCVar24 = pCVar3;
  if (((pCVar23->image_id).id == id_00.id) &&
     (pCVar24 = pCVar23, (pCVar23->sampler_id).id != id_01.id)) {
    pCVar24 = pCVar3;
  }
LAB_0033a4cc:
  if (pCVar24 == pCVar3) {
    if (bVar13) {
      uVar14 = ParsedIR::increase_bound_by(&pCVar26->ir,1);
      local_6c._4_4_ = uVar14;
      pSVar18 = set<spirv_cross::SPIRType>(this->compiler,uVar14);
      pCVar26 = this->compiler;
      uVar14 = expression_type_id(pCVar26,args[2]);
      pSVar21 = Variant::get<spirv_cross::SPIRType>
                          ((pCVar26->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar14);
      (pSVar18->super_IVariant).self.id = (pSVar21->super_IVariant).self.id;
      uVar14 = pSVar21->vecsize;
      uVar15 = pSVar21->columns;
      *(undefined8 *)&(pSVar18->super_IVariant).field_0xc =
           *(undefined8 *)&(pSVar21->super_IVariant).field_0xc;
      pSVar18->vecsize = uVar14;
      pSVar18->columns = uVar15;
      SmallVector<unsigned_int,_8UL>::operator=(&pSVar18->array,&pSVar21->array);
      SmallVector<bool,_8UL>::operator=(&pSVar18->array_size_literal,&pSVar21->array_size_literal);
      bVar13 = pSVar21->pointer;
      bVar4 = pSVar21->forward_pointer;
      uVar5 = *(undefined2 *)&pSVar21->field_0x7e;
      pSVar18->pointer_depth = pSVar21->pointer_depth;
      pSVar18->pointer = bVar13;
      pSVar18->forward_pointer = bVar4;
      *(undefined2 *)&pSVar18->field_0x7e = uVar5;
      pSVar18->storage = pSVar21->storage;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                (&pSVar18->member_types,&pSVar21->member_types);
      SmallVector<unsigned_int,_8UL>::operator=
                (&pSVar18->member_type_index_redirection,&pSVar21->member_type_index_redirection);
      DVar6 = (pSVar21->image).dim;
      bVar13 = (pSVar21->image).depth;
      bVar4 = (pSVar21->image).arrayed;
      bVar7 = (pSVar21->image).ms;
      uVar8 = (pSVar21->image).field_0xb;
      uVar14 = (pSVar21->image).sampled;
      IVar9 = (pSVar21->image).format;
      AVar10 = (pSVar21->image).access;
      TVar11.id = (pSVar21->type_alias).id;
      TVar12.id = (pSVar21->parent_type).id;
      (pSVar18->image).type = (TypeID)(pSVar21->image).type.id;
      (pSVar18->image).dim = DVar6;
      (pSVar18->image).depth = bVar13;
      (pSVar18->image).arrayed = bVar4;
      (pSVar18->image).ms = bVar7;
      (pSVar18->image).field_0xb = uVar8;
      (pSVar18->image).sampled = uVar14;
      (pSVar18->image).format = IVar9;
      (pSVar18->image).access = AVar10;
      pSVar18->type_alias = (TypeID)TVar11.id;
      pSVar18->parent_type = (TypeID)TVar12.id;
      if (pSVar21 != pSVar18) {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&pSVar18->member_name_cache,&(pSVar21->member_name_cache)._M_h);
      }
      (pSVar18->super_IVariant).self.id = local_6c._4_4_;
      *(undefined4 *)&(pSVar18->super_IVariant).field_0xc = 0x11;
      (pSVar18->image).depth = false;
      local_70.id = 0;
      uVar14 = local_6c._4_4_;
    }
    else {
      uVar14 = *args;
      local_70.id = args[1];
    }
    uVar15 = ParsedIR::increase_bound_by(&this->compiler->ir,2);
    local_60[0] = (undefined1 *)CONCAT44(local_60[0]._4_4_,uVar15);
    id.id = uVar15 + 1;
    pSVar18 = set<spirv_cross::SPIRType>(this->compiler,uVar15);
    pSVar21 = Variant::get<spirv_cross::SPIRType>
                        ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                         uVar14);
    (pSVar18->super_IVariant).self.id = (pSVar21->super_IVariant).self.id;
    uVar14 = pSVar21->vecsize;
    uVar15 = pSVar21->columns;
    *(undefined8 *)&(pSVar18->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar21->super_IVariant).field_0xc;
    pSVar18->vecsize = uVar14;
    pSVar18->columns = uVar15;
    local_6c._4_8_ = &pSVar18->array;
    SmallVector<unsigned_int,_8UL>::operator=
              ((SmallVector<unsigned_int,_8UL> *)local_6c._4_8_,&pSVar21->array);
    local_40 = &pSVar18->array_size_literal;
    SmallVector<bool,_8UL>::operator=(local_40,&pSVar21->array_size_literal);
    bVar13 = pSVar21->pointer;
    bVar4 = pSVar21->forward_pointer;
    uVar5 = *(undefined2 *)&pSVar21->field_0x7e;
    pSVar18->pointer_depth = pSVar21->pointer_depth;
    pSVar18->pointer = bVar13;
    pSVar18->forward_pointer = bVar4;
    *(undefined2 *)&pSVar18->field_0x7e = uVar5;
    pSVar18->storage = pSVar21->storage;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar18->member_types,&pSVar21->member_types);
    SmallVector<unsigned_int,_8UL>::operator=
              (&pSVar18->member_type_index_redirection,&pSVar21->member_type_index_redirection);
    DVar6 = (pSVar21->image).dim;
    bVar13 = (pSVar21->image).depth;
    bVar4 = (pSVar21->image).arrayed;
    bVar7 = (pSVar21->image).ms;
    uVar8 = (pSVar21->image).field_0xb;
    uVar14 = (pSVar21->image).sampled;
    IVar9 = (pSVar21->image).format;
    AVar10 = (pSVar21->image).access;
    TVar11.id = (pSVar21->type_alias).id;
    TVar12.id = (pSVar21->parent_type).id;
    (pSVar18->image).type = (TypeID)(pSVar21->image).type.id;
    (pSVar18->image).dim = DVar6;
    (pSVar18->image).depth = bVar13;
    (pSVar18->image).arrayed = bVar4;
    (pSVar18->image).ms = bVar7;
    (pSVar18->image).field_0xb = uVar8;
    (pSVar18->image).sampled = uVar14;
    (pSVar18->image).format = IVar9;
    (pSVar18->image).access = AVar10;
    pSVar18->type_alias = (TypeID)TVar11.id;
    pSVar18->parent_type = (TypeID)TVar12.id;
    if (pSVar21 != pSVar18) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar18->member_name_cache,&(pSVar21->member_name_cache)._M_h);
    }
    pSVar18->pointer = true;
    pSVar18->storage = StorageClassUniformConstant;
    (pSVar18->parent_type).id = (uint32_t)local_60[0];
    local_6c._0_4_ = StorageClassUniformConstant;
    local_34 = 0;
    set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
              (this->compiler,id.id,(uint *)local_60,(StorageClass *)local_6c,&local_34);
    if ((((id_01.id != 0) &&
         (bVar13 = ParsedIR::has_decoration(&this->compiler->ir,id_01,DecorationRelaxedPrecision),
         bVar13)) ||
        ((id_00.id != 0 &&
         (bVar13 = ParsedIR::has_decoration(&this->compiler->ir,id_00,DecorationRelaxedPrecision),
         bVar13)))) ||
       ((local_70.id != 0 &&
        (bVar13 = ParsedIR::has_decoration(&this->compiler->ir,local_70,DecorationRelaxedPrecision),
        bVar13)))) {
      ParsedIR::set_decoration(&this->compiler->ir,id,DecorationRelaxedPrecision,0);
    }
    pSVar17 = maybe_get_backing_variable(this->compiler,id_00.id);
    if (pSVar17 != (SPIRVariable *)0x0) {
      pSVar18 = Variant::get<spirv_cross::SPIRType>
                          ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                           *(uint *)&(pSVar17->super_IVariant).field_0xc);
      SmallVector<unsigned_int,_8UL>::operator=
                ((SmallVector<unsigned_int,_8UL> *)local_6c._4_8_,&pSVar18->array);
      SmallVector<bool,_8UL>::operator=(local_40,&pSVar18->array_size_literal);
    }
    pCVar26 = this->compiler;
    SmallVector<spirv_cross::CombinedImageSampler,_8UL>::reserve
              (&pCVar26->combined_image_samplers,
               (pCVar26->combined_image_samplers).
               super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size + 1);
    pCVar3 = (pCVar26->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
             ptr;
    sVar2 = (pCVar26->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
            buffer_size;
    pCVar3[sVar2].combined_id.id = id.id;
    pCVar3[sVar2].image_id.id = id_00.id;
    pCVar3[sVar2].sampler_id.id = id_01.id;
    (pCVar26->combined_image_samplers).super_VectorView<spirv_cross::CombinedImageSampler>.
    buffer_size = sVar2 + 1;
  }
  return true;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// We need to figure out where samplers and images are loaded from, so do only the bare bones compilation we need.
	bool is_fetch = false;

	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;

		// If not separate image or sampler, don't bother.
		if (!separate_image && !separate_sampler)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		return true;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		// Technically, it is possible to have arrays of textures and arrays of samplers and combine them, but this becomes essentially
		// impossible to implement, since we don't know which concrete sampler we are accessing.
		// One potential way is to create a combinatorial explosion where N textures and M samplers are combined into N * M sampler2Ds,
		// but this seems ridiculously complicated for a problem which is easy to work around.
		// Checking access chains like this assumes we don't have samplers or textures inside uniform structs, but this makes no sense.

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;
		if (separate_sampler)
			SPIRV_CROSS_THROW(
			    "Attempting to use arrays or structs of separate samplers. This is not possible to statically "
			    "remap to plain GLSL.");

		if (separate_image)
		{
			uint32_t id = args[1];
			uint32_t ptr = args[2];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
		}
		return true;
	}

	case OpImageFetch:
	case OpImageQuerySizeLod:
	case OpImageQuerySize:
	case OpImageQueryLevels:
	case OpImageQuerySamples:
	{
		// If we are fetching from a plain OpTypeImage or querying LOD, we must pre-combine with our dummy sampler.
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (!var)
			return true;

		auto &type = compiler.get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (compiler.dummy_sampler_id == 0)
				SPIRV_CROSS_THROW("texelFetch without sampler was found, but no dummy sampler has been created with "
				                  "build_dummy_sampler_for_combined_images().");

			// Do it outside.
			is_fetch = true;
			break;
		}

		return true;
	}

	case OpSampledImage:
		// Do it outside.
		break;

	default:
		return true;
	}

	// Registers sampler2D calls used in case they are parameters so
	// that their callees know which combined image samplers to propagate down the call stack.
	if (!functions.empty())
	{
		auto &callee = *functions.top();
		if (callee.do_combined_parameters)
		{
			uint32_t image_id = args[2];

			auto *image = compiler.maybe_get_backing_variable(image_id);
			if (image)
				image_id = image->self;

			uint32_t sampler_id = is_fetch ? compiler.dummy_sampler_id : args[3];
			auto *sampler = compiler.maybe_get_backing_variable(sampler_id);
			if (sampler)
				sampler_id = sampler->self;

			uint32_t combined_id = args[1];

			auto &combined_type = compiler.get<SPIRType>(args[0]);
			register_combined_image_sampler(callee, combined_id, image_id, sampler_id, combined_type.image.depth);
		}
	}

	// For function calls, we need to remap IDs which are function parameters into global variables.
	// This information is statically known from the current place in the call stack.
	// Function parameters are not necessarily pointers, so if we don't have a backing variable, remapping will know
	// which backing variable the image/sample came from.
	VariableID image_id = remap_parameter(args[2]);
	VariableID sampler_id = is_fetch ? compiler.dummy_sampler_id : remap_parameter(args[3]);

	auto itr = find_if(begin(compiler.combined_image_samplers), end(compiler.combined_image_samplers),
	                   [image_id, sampler_id](const CombinedImageSampler &combined) {
		                   return combined.image_id == image_id && combined.sampler_id == sampler_id;
	                   });

	if (itr == end(compiler.combined_image_samplers))
	{
		uint32_t sampled_type;
		uint32_t combined_module_id;
		if (is_fetch)
		{
			// Have to invent the sampled image type.
			sampled_type = compiler.ir.increase_bound_by(1);
			auto &type = compiler.set<SPIRType>(sampled_type);
			type = compiler.expression_type(args[2]);
			type.self = sampled_type;
			type.basetype = SPIRType::SampledImage;
			type.image.depth = false;
			combined_module_id = 0;
		}
		else
		{
			sampled_type = args[0];
			combined_module_id = args[1];
		}

		auto id = compiler.ir.increase_bound_by(2);
		auto type_id = id + 0;
		auto combined_id = id + 1;

		// Make a new type, pointer to OpTypeSampledImage, so we can make a variable of this type.
		// We will probably have this type lying around, but it doesn't hurt to make duplicates for internal purposes.
		auto &type = compiler.set<SPIRType>(type_id);
		auto &base = compiler.get<SPIRType>(sampled_type);
		type = base;
		type.pointer = true;
		type.storage = StorageClassUniformConstant;
		type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, type_id, StorageClassUniformConstant, 0);

		// Inherit RelaxedPrecision (and potentially other useful flags if deemed relevant).
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    (sampler_id && compiler.has_decoration(sampler_id, DecorationRelaxedPrecision)) ||
		    (image_id && compiler.has_decoration(image_id, DecorationRelaxedPrecision)) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		// Propagate the array type for the original image as well.
		auto *var = compiler.maybe_get_backing_variable(image_id);
		if (var)
		{
			auto &parent_type = compiler.get<SPIRType>(var->basetype);
			type.array = parent_type.array;
			type.array_size_literal = parent_type.array_size_literal;
		}

		compiler.combined_image_samplers.push_back({ combined_id, image_id, sampler_id });
	}

	return true;
}